

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O2

void load_jpg_entry_helper(ALLEGRO_FILE *fp,load_jpg_entry_helper_data *data,int flags)

{
  uchar uVar1;
  JDIMENSION JVar2;
  char cVar3;
  int iVar4;
  JDIMENSION JVar5;
  JOCTET *pJVar6;
  ALLEGRO_BITMAP *pAVar7;
  long *plVar8;
  uchar *puVar9;
  long lVar10;
  undefined4 in_register_00000014;
  uchar *puVar11;
  uchar *out [1];
  jpeg_decompress_struct cinfo;
  my_err_mgr jerr;
  
  data->error = false;
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr,data,CONCAT44(in_register_00000014,flags));
  jerr.pub.error_exit = my_error_exit;
  iVar4 = _setjmp((__jmp_buf_tag *)jerr.jmpenv);
  if (iVar4 == 0) {
    pJVar6 = (JOCTET *)
             al_malloc_with_context
                       (0x1000,0xb8,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                        ,"load_jpg_entry_helper");
    data->buffer = pJVar6;
    if (pJVar6 == (JOCTET *)0x0) {
      data->error = true;
    }
    else {
      jpeg_CreateDecompress(&cinfo,0x50,0x290);
      pJVar6 = data->buffer;
      if (cinfo.src == (jpeg_source_mgr *)0x0) {
        cinfo.src = (jpeg_source_mgr *)(*(cinfo.mem)->alloc_small)((j_common_ptr)&cinfo,0,0x48);
      }
      (cinfo.src)->init_source = init_source;
      (cinfo.src)->fill_input_buffer = fill_input_buffer;
      (cinfo.src)->skip_input_data = skip_input_data;
      (cinfo.src)->resync_to_restart = jpeg_resync_to_restart;
      (cinfo.src)->term_source = term_source;
      (cinfo.src)->bytes_in_buffer = 0;
      cinfo.src[1].next_input_byte = pJVar6;
      cinfo.src[1].bytes_in_buffer = (size_t)fp;
      jpeg_read_header(&cinfo,1);
      jpeg_start_decompress(&cinfo);
      if ((cinfo.output_components & 0xfffffffdU) == 1) {
        pAVar7 = (ALLEGRO_BITMAP *)al_create_bitmap(cinfo.output_width,cinfo.output_height);
        data->bmp = pAVar7;
        if (pAVar7 == (ALLEGRO_BITMAP *)0x0) {
          data->error = true;
          cVar3 = _al_trace_prefix("image",3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                   ,0xd1,"load_jpg_entry_helper");
          if (cVar3 != '\0') {
            _al_trace_suffix("%dx%d bitmap creation failed\n",cinfo.output_width,cinfo.output_height
                            );
          }
        }
        else {
          plVar8 = (long *)al_lock_bitmap(pAVar7,0x13,2);
          if (cinfo.output_components == 1) {
            puVar9 = (uchar *)al_malloc_with_context
                                        ((long)(int)cinfo.output_width,0xf6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                         ,"load_jpg_entry_helper");
            data->row = puVar9;
            JVar5 = 0;
            if (0 < (int)cinfo.output_width) {
              JVar5 = cinfo.output_width;
            }
            while (JVar2 = cinfo.output_scanline,
                  (int)cinfo.output_scanline < (int)cinfo.output_height) {
              jpeg_read_scanlines(&cinfo,&data->row,1);
              puVar9 = data->row;
              puVar11 = (uchar *)((long)(int)JVar2 * (long)*(int *)((long)plVar8 + 0xc) + *plVar8);
              for (lVar10 = 0; JVar5 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
                uVar1 = puVar9[lVar10];
                *puVar11 = uVar1;
                puVar11[1] = uVar1;
                puVar11[2] = puVar9[lVar10];
                puVar11 = puVar11 + 3;
              }
            }
          }
          else if (cinfo.output_components == 3) {
            while ((int)cinfo.output_scanline < (int)cinfo.output_height) {
              out[0] = (uchar *)((long)(int)cinfo.output_scanline *
                                 (long)*(int *)((long)plVar8 + 0xc) + *plVar8);
              jpeg_read_scanlines(&cinfo,out,1);
            }
          }
        }
      }
      else {
        data->error = true;
        cVar3 = _al_trace_prefix("image",3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                                 ,0xca,"load_jpg_entry_helper");
        if (cVar3 != '\0') {
          _al_trace_suffix("%d components makes no sense\n",cinfo.output_components);
        }
      }
    }
    jpeg_finish_decompress(&cinfo);
  }
  else {
    data->error = true;
  }
  jpeg_destroy_decompress(&cinfo);
  if (data->bmp != (ALLEGRO_BITMAP *)0x0) {
    cVar3 = al_is_bitmap_locked();
    if (cVar3 != '\0') {
      al_unlock_bitmap(data->bmp);
    }
    if (data->error == true) {
      al_destroy_bitmap(data->bmp);
      data->bmp = (ALLEGRO_BITMAP *)0x0;
    }
  }
  al_free_with_context
            (data->buffer,0x114,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  al_free_with_context
            (data->row,0x115,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"load_jpg_entry_helper");
  return;
}

Assistant:

static void load_jpg_entry_helper(ALLEGRO_FILE *fp,
   struct load_jpg_entry_helper_data *data, int flags)
{
   struct jpeg_decompress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;
   int w, h, s;

   /* ALLEGRO_NO_PREMULTIPLIED_ALPHA does not apply.
    * ALLEGRO_KEEP_INDEX does not apply.
    */
   (void)flags;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv) != 0) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_decompress(&cinfo);
   jpeg_packfile_src(&cinfo, fp, data->buffer);
   jpeg_read_header(&cinfo, true);
   jpeg_start_decompress(&cinfo);

   w = cinfo.output_width;
   h = cinfo.output_height;
   s = cinfo.output_components;

   /* Only one and three components make sense in a JPG file. */
   if (s != 1 && s != 3) {
      data->error = true;
      ALLEGRO_ERROR("%d components makes no sense\n", s);
      goto error;
   }

   data->bmp = al_create_bitmap(w, h);
   if (!data->bmp) {
      data->error = true;
      ALLEGRO_ERROR("%dx%d bitmap creation failed\n", w, h);
      goto error;
   }

   /* Allegro's pixel format is endian independent, so that in
    * ALLEGRO_PIXEL_FORMAT_RGB_888 the lower 8 bits always hold the Blue
    * component.  On a little endian system this is in byte 0.  On a big
    * endian system this is in byte 2.
    *
    * libjpeg expects byte 0 to hold the Red component, byte 1 to hold the
    * Green component, byte 2 to hold the Blue component.  Hence on little
    * endian systems we need the opposite format, ALLEGRO_PIXEL_FORMAT_BGR_888.
    */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
       ALLEGRO_LOCK_WRITEONLY);
#else
   lock = al_lock_bitmap(data->bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
       ALLEGRO_LOCK_WRITEONLY);
#endif

   if (s == 3) {
      /* Colour. */
      int y;

      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         unsigned char *out[1];
         out[0] = ((unsigned char *)lock->data) + y * lock->pitch;
         jpeg_read_scanlines(&cinfo, (void *)out, 1);
      }
   }
   else if (s == 1) {
      /* Greyscale. */
      unsigned char *in;
      unsigned char *out;
      int x, y;

      data->row = al_malloc(w);
      for (y = cinfo.output_scanline; y < h; y = cinfo.output_scanline) {
         jpeg_read_scanlines(&cinfo, (void *)&data->row, 1);
         in = data->row;
         out = ((unsigned char *)lock->data) + y * lock->pitch;
         for (x = 0; x < w; x++) {
            *out++ = *in;
            *out++ = *in;
            *out++ = *in;
            in++;
         }
      }
   }

 error:
   jpeg_finish_decompress(&cinfo);

 longjmp_error:
   jpeg_destroy_decompress(&cinfo);

   if (data->bmp) {
      if (al_is_bitmap_locked(data->bmp)) {
         al_unlock_bitmap(data->bmp);
      }
      if (data->error) {
         al_destroy_bitmap(data->bmp);
         data->bmp = NULL;
      }
   }

   al_free(data->buffer);
   al_free(data->row);
}